

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_iarchive.h
# Opt level: O3

void __thiscall serialization::json_iarchive::load_object_start(json_iarchive *this)

{
  _Elt_pointer ppGVar1;
  undefined8 *puVar2;
  
  ppGVar1 = (this->stack_).c.
            super__Deque_base<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppGVar1 ==
      (this->stack_).c.
      super__Deque_base<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    __assert_fail("!stack_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/avplayer[P]serialization2/examples/../include/serialization/detail/json_iarchive.h"
                  ,0x49,"void serialization::json_iarchive::load_object_start() const");
  }
  if (ppGVar1 ==
      (this->stack_).c.
      super__Deque_base<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppGVar1 = (this->stack_).c.
              super__Deque_base<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  if ((ppGVar1[-1]->data_).f.flags == 3) {
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x18);
  *puVar2 = &PTR__exception_00120d50;
  puVar2[1] = "";
  puVar2[2] = "expect object";
  __cxa_throw(puVar2,&serialization_error::typeinfo,std::exception::~exception);
}

Assistant:

void load_object_start() const
    {
        serialization_trace trace(__func__, "json");
        assert(!stack_.empty());
        if(stack_.empty() || (!stack_.top()->IsObject()))
            throw_serialization_error("expect object", "");
    }